

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O2

int main(int argc,char **argv)

{
  uchar *puVar1;
  char cVar2;
  logdir *plVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  char ch;
  
  progname = *argv;
LAB_001050c4:
  iVar4 = sgetoptmine(argc,argv,"R:r:l:b:tvV");
  if (iVar4 == subgetoptdone) {
    lVar8 = (long)subgetoptind;
    dirn = argc - subgetoptind;
    if (dirn == 0) {
      usage();
    }
    if (buflen <= linemax) {
      usage();
    }
    fdwdir = open_read(".");
    if (fdwdir == -1) {
      fatal("unable to open current working directory");
    }
    coe(fdwdir);
    dir = (logdir *)alloc(dirn * 0xf0);
    if (dir == (logdir *)0x0) {
      die_nomem();
    }
    lVar9 = 0;
    for (uVar10 = 0; plVar3 = dir, uVar10 < dirn; uVar10 = uVar10 + 1) {
      *(undefined4 *)((long)&dir->fddir + lVar9) = 0xffffffff;
      puVar1 = (plVar3->udpaddr).sin_zero + lVar9 + -0x14;
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
      pcVar6 = alloc((uint)buflen);
      *(char **)((long)&dir->btmp + lVar9) = pcVar6;
      if (*(long *)((long)&dir->btmp + lVar9) == 0) {
        die_nomem();
      }
      pcVar6 = dir->fnsave + lVar9 + -4;
      pcVar6[0] = '\0';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      lVar9 = lVar9 + 0xf0;
    }
    databuf = alloc((uint)buflen);
    if (databuf == (char *)0x0) {
      die_nomem();
    }
    buffer_init(&data,buffer_pread,0,databuf,(uint)buflen);
    line = alloc((uint)linemax);
    if (line == (char *)0x0) {
      die_nomem();
    }
    in.fd = 0;
    in.events = 1;
    fndir = argv + lVar8;
    ndelay_on(0);
    sig_block(sig_term);
    sig_block(sig_child);
    sig_block(sig_alarm);
    sig_block(sig_hangup);
    sig_catch(sig_term,sig_term_handler);
    sig_catch(sig_child,sig_child_handler);
    sig_catch(sig_alarm,sig_alarm_handler);
    sig_catch(sig_hangup,sig_hangup_handler);
    logdirs_reopen();
    do {
      for (linelen = 0; linelen < linemax; linelen = linelen + 1) {
        if (data.p == 0) {
          iVar4 = buffer_get(&data,&ch,1);
          if (iVar4 < 1) {
            exitasap = 1;
            bVar11 = false;
            goto LAB_00105531;
          }
        }
        else {
          ch = data.x[data.n];
          data.p = data.p - 1;
          data.n = data.n + 1;
        }
        if ((linelen == 0) && (timestamp != 0)) {
          taia_now(&now);
          if (timestamp == 3) {
            fmt_ptime_iso8601(stamp,&now);
          }
          else if (timestamp == 2) {
            fmt_ptime(stamp,&now);
          }
          else if (timestamp == 1) {
            fmt_taia(stamp,&now);
          }
          stamp[0x19] = ' ';
          stamp[0x1a] = '\0';
        }
        if (ch == '\n') break;
        if (repl != '\0') {
          pcVar6 = replace;
          if (0xa0 < (byte)(ch + 0x81U)) {
            do {
              cVar2 = *pcVar6;
              if (cVar2 == '\0') goto LAB_00105507;
              pcVar6 = pcVar6 + 1;
            } while (ch != cVar2);
          }
          ch = repl;
        }
LAB_00105507:
        line[linelen] = ch;
      }
      bVar11 = exitasap == 0;
LAB_00105531:
      if ((!bVar11) && (data.p == 0)) {
        for (uVar10 = 0; uVar10 < dirn; uVar10 = uVar10 + 1) {
          if (dir[uVar10].ppid != 0) {
            do {
              uVar5 = processorstop(dir + uVar10);
            } while (uVar5 == 0);
          }
          logdir_close(dir + uVar10);
        }
        _exit(0);
      }
      for (uVar10 = 0; uVar10 < dirn; uVar10 = uVar10 + 1) {
        if (dir[uVar10].fddir != -1) {
          if (dir[uVar10].inst.len != 0) {
            logmatch(dir + uVar10);
          }
          if (dir[uVar10].matcherr == 'e') {
            if (timestamp != 0) {
              buffer_puts(buffer_2,stamp);
            }
            if (dir[uVar10].prefix.len != 0) {
              buffer_puts(buffer_2,dir[uVar10].prefix.s);
            }
            buffer_put(buffer_2,line,(uint)linelen);
            if (linelen == linemax) {
              buffer_puts(buffer_2,"...");
            }
            buffer_put(buffer_2,"\n",1);
            buffer_flush(buffer_2);
          }
          if (dir[uVar10].match == '+') {
            if (dir[uVar10].udpaddr.sin_port != 0) {
              fdudp = socket(2,2,0);
              if (fdudp == 0) {
LAB_0010568d:
                while (iVar4 = stralloc_copys(&sa,""), iVar4 == 0) {
                  pause_nomem();
                }
                if (timestamp != 0) {
                  while (iVar4 = stralloc_cats(&sa,stamp), iVar4 == 0) {
                    pause_nomem();
                  }
                }
                if (dir[uVar10].prefix.len != 0) {
                  while (iVar4 = stralloc_cats(&sa,dir[uVar10].prefix.s), iVar4 == 0) {
                    pause_nomem();
                  }
                }
                while( true ) {
                  iVar4 = stralloc_catb(&sa,line,(uint)linelen);
                  if (iVar4 != 0) break;
                  pause_nomem();
                }
                if (linelen == linemax) {
                  while (iVar4 = stralloc_cats(&sa,"..."), iVar4 == 0) {
                    pause_nomem();
                  }
                }
                while (iVar4 = stralloc_append(&sa,"\n"), iVar4 == 0) {
                  pause_nomem();
                }
                uVar7 = sendto(fdudp,sa.s,(ulong)sa.len,0,(sockaddr *)&dir[uVar10].udpaddr,0x10);
                if (uVar7 != sa.len) {
                  buffer_puts(&dir[uVar10].b,"warning: failure sending through udp: ");
                  buffer_put(&dir[uVar10].b,sa.s,sa.len);
                  buffer_flush(&dir[uVar10].b);
                }
                close(fdudp);
              }
              else {
                iVar4 = ndelay_on(fdudp);
                if (iVar4 == -1) {
                  close(fdudp);
                  fdudp = -1;
                }
                else if (fdudp != -1) goto LAB_0010568d;
                buffer_puts(&dir[uVar10].b,"warning: no udp socket available: ");
                if (timestamp != 0) {
                  buffer_puts(&dir[uVar10].b,stamp);
                }
                if (dir[uVar10].prefix.len != 0) {
                  buffer_puts(&dir[uVar10].b,dir[uVar10].prefix.s);
                }
                buffer_put(&dir[uVar10].b,line,(uint)linelen);
                buffer_put(&dir[uVar10].b,"\n",1);
                buffer_flush(&dir[uVar10].b);
              }
            }
            if (dir[uVar10].udponly == 0) {
              if (timestamp != 0) {
                buffer_puts(&dir[uVar10].b,stamp);
              }
              if (dir[uVar10].prefix.len != 0) {
                buffer_puts(&dir[uVar10].b,dir[uVar10].prefix.s);
              }
              buffer_put(&dir[uVar10].b,line,(uint)linelen);
            }
          }
        }
      }
      if (linelen == linemax) {
        do {
          if (data.p == 0) {
            iVar4 = buffer_get(&data,&ch,1);
            if (iVar4 < 1) {
              exitasap = 1;
              break;
            }
          }
          else {
            ch = data.x[data.n];
            data.p = data.p - 1;
            data.n = data.n + 1;
          }
          if (ch == '\n') break;
          lVar8 = 0;
          for (uVar10 = 0; uVar10 < dirn; uVar10 = uVar10 + 1) {
            if (((*(int *)((long)&dir->fddir + lVar8) != -1) &&
                ((dir->udpaddr).sin_zero[lVar8 + -0xc] == '+')) &&
               (*(int *)((long)(&dir->udpaddr + 1) + lVar8) == 0)) {
              uVar5 = *(uint *)(dir->fnsave + lVar8 + -0x7c);
              if (*(uint *)(dir->fnsave + lVar8 + -0x78) == uVar5) {
                buffer_put((buffer *)((long)&(dir->b).x + lVar8),&ch,1);
              }
              else {
                lVar9 = *(long *)((long)&(dir->b).x + lVar8);
                *(uint *)(dir->fnsave + lVar8 + -0x7c) = uVar5 + 1;
                *(char *)(lVar9 + (ulong)uVar5) = ch;
              }
            }
            lVar8 = lVar8 + 0xf0;
          }
        } while( true );
      }
      lVar8 = 0;
      uVar5 = dirn;
      for (uVar10 = 0; uVar10 < uVar5; uVar10 = uVar10 + 1) {
        if (((*(int *)((long)&dir->fddir + lVar8) != -1) &&
            ((dir->udpaddr).sin_zero[lVar8 + -0xc] == '+')) &&
           (*(int *)((long)(&dir->udpaddr + 1) + lVar8) == 0)) {
          ch = '\n';
          uVar5 = *(uint *)(dir->fnsave + lVar8 + -0x7c);
          if (*(uint *)(dir->fnsave + lVar8 + -0x78) == uVar5) {
            buffer_put((buffer *)((long)&(dir->b).x + lVar8),&ch,1);
          }
          else {
            lVar9 = *(long *)((long)&(dir->b).x + lVar8);
            *(uint *)(dir->fnsave + lVar8 + -0x7c) = uVar5 + 1;
            *(undefined1 *)(lVar9 + (ulong)uVar5) = 10;
          }
          buffer_flush((buffer *)((long)&(dir->b).x + lVar8));
          uVar5 = dirn;
        }
        lVar8 = lVar8 + 0xf0;
      }
    } while( true );
  }
  if (iVar4 != 0x3f) {
    if (iVar4 == 0x76) {
      verbose = verbose + 1;
      goto LAB_001050c4;
    }
    if (iVar4 == 0x56) {
      strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0)
      ;
      goto LAB_001051e6;
    }
    if (iVar4 == 0x62) {
      scan_ulong(subgetoptarg,&buflen);
      if (buflen == 0) {
        buflen = 0x400;
      }
      goto LAB_001050c4;
    }
    if (iVar4 == 0x6c) {
      scan_ulong(subgetoptarg,&linemax);
      if (linemax == 0) {
        linemax = 1000;
      }
      goto LAB_001050c4;
    }
    if (iVar4 != 0x72) {
      if (iVar4 == 0x74) {
        timestamp = timestamp + 1;
        if (2 < timestamp) {
          timestamp = 3;
        }
      }
      else if (iVar4 == 0x52) {
        replace = subgetoptarg;
        if (repl == '\0') {
          repl = '_';
        }
      }
      goto LAB_001050c4;
    }
    repl = *subgetoptarg;
    if ((repl != '\0') && (subgetoptarg[1] == '\0')) goto LAB_001050c4;
  }
LAB_001051e6:
  usage();
  goto LAB_001050c4;
}

Assistant:

int main(int argc, const char **argv) {
  int i;
  int opt;

  progname =*argv;

  while ((opt =getopt(argc, argv, "R:r:l:b:tvV")) != opteof) {
    switch(opt) {
    case 'R':
      replace =optarg;
      if (! repl) repl ='_';
      break;
    case 'r':
      repl =*optarg;
      if (! repl || *(optarg +1)) usage();
      break;
    case 'l':
      scan_ulong(optarg, &linemax);
      if (linemax == 0) linemax =1000;
      break;
    case 'b':
      scan_ulong(optarg, &buflen);
      if (buflen == 0) buflen =1024;
      break;
    case 't':
      if (++timestamp > 3) timestamp =3;
      break;
    case 'v':
      ++verbose;
      break;
    case 'V': strerr_warn1(VERSION, 0);
    case '?': usage();
    }
  }
  argv +=optind;

  dirn =argc -optind;
  if (dirn <= 0) usage();
  if (buflen <= linemax) usage();
  if ((fdwdir =open_read(".")) == -1)
    fatal("unable to open current working directory");
  coe(fdwdir);
  dir =(struct logdir*)alloc(dirn *sizeof(struct logdir));
  if (! dir) die_nomem();
  for (i =0; i < dirn; ++i) {
    dir[i].fddir =-1; dir[i].fdcur =-1;
    dir[i].btmp =(char*)alloc(buflen *sizeof(char));
    if (! dir[i].btmp) die_nomem();
    dir[i].ppid =0;
  }
  databuf =(char*)alloc(buflen *sizeof(char));
  if (! databuf) die_nomem();
  buffer_init(&data, buffer_pread, 0, databuf, buflen);
  line =(char*)alloc(linemax *sizeof(char));
  if (! line) die_nomem();
  fndir =argv;
  in.fd =0;
  in.events =IOPAUSE_READ;
  ndelay_on(in.fd);

  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  sig_catch(sig_term, sig_term_handler);
  sig_catch(sig_child, sig_child_handler);
  sig_catch(sig_alarm, sig_alarm_handler);
  sig_catch(sig_hangup, sig_hangup_handler);

  logdirs_reopen();

  for(;;) {
    char ch;

    linelen =0;
    for (linelen =0; linelen < linemax; ++linelen) {
      if (buffer_GETC(&data, &ch) <= 0) {
        exitasap =1;
        break;
      }
      if (! linelen && timestamp) {
        taia_now(&now);
        switch (timestamp) {
        case 1: fmt_taia(stamp, &now); break;
        case 2: fmt_ptime(stamp, &now); break;
        case 3: fmt_ptime_iso8601(stamp, &now); break;
        }
        stamp[25] =' '; stamp[26] =0;
      }
      if (ch == '\n') break;
      if (repl) {
        if ((ch < 32) || (ch > 126))
          ch =repl;
        else
          for (i =0; replace[i]; ++i)
            if (ch == replace[i]) {
              ch =repl;
              break;
            }
      }
      line[linelen] =ch;
    }
    if (exitasap && ! data.p) break; /* data buffer is empty */
    for (i =0; i < dirn; ++i)
      if (dir[i].fddir != -1) {
        if (dir[i].inst.len) logmatch(&dir[i]);
        if (dir[i].matcherr == 'e') {
          if (timestamp) buffer_puts(buffer_2, stamp);
          if (dir[i].prefix.len) buffer_puts(buffer_2, dir[i].prefix.s);
          buffer_put(buffer_2, line, linelen);
          if (linelen == linemax) buffer_puts(buffer_2, "...");
          buffer_put(buffer_2, "\n", 1); buffer_flush(buffer_2);
        }
        if (dir[i].match != '+') continue;
        if (dir[i].udpaddr.sin_port != 0) {
          fdudp =socket(AF_INET, SOCK_DGRAM, 0);
          if (fdudp)
            if (ndelay_on(fdudp) == -1) {
              close(fdudp);
              fdudp =-1;
            }
          if (fdudp == -1) {
            buffer_puts(&dir[i].b, "warning: no udp socket available: ");
            if (timestamp) buffer_puts(&dir[i].b, stamp);
            if (dir[i].prefix.len) buffer_puts(&dir[i].b, dir[i].prefix.s);
            buffer_put(&dir[i].b, line, linelen);
            buffer_put(&dir[i].b, "\n", 1);
            buffer_flush(&dir[i].b);
          }
          else {
            while (! stralloc_copys(&sa, "")) pause_nomem();
            if (timestamp)
              while (! stralloc_cats(&sa, stamp)) pause_nomem();
            if (dir[i].prefix.len)
              while (! stralloc_cats(&sa, dir[i].prefix.s)) pause_nomem();
            while (! stralloc_catb(&sa, line, linelen)) pause_nomem();
            if (linelen == linemax)
              while (! stralloc_cats(&sa, "...")) pause_nomem();
            while (! stralloc_append(&sa, "\n")) pause_nomem();
            if (sendto(fdudp, sa.s, sa.len, 0,
                       (struct sockaddr *)&dir[i].udpaddr,
                       sizeof(dir[i].udpaddr)) != sa.len) {
              buffer_puts(&dir[i].b, "warning: failure sending through udp: ");
              buffer_put(&dir[i].b, sa.s, sa.len);
              buffer_flush(&dir[i].b);
            }
            close(fdudp);
          }
        }
        if (! dir[i].udponly) {
          if (timestamp) buffer_puts(&dir[i].b, stamp);
          if (dir[i].prefix.len) buffer_puts(&dir[i].b, dir[i].prefix.s);
          buffer_put(&dir[i].b, line, linelen);
        }
      }
    if (linelen == linemax)
      for (;;) {
        if (buffer_GETC(&data, &ch) <= 0) {
          exitasap =1;
          break;
        }
        if (ch == '\n') break;
        for (i =0; i < dirn; ++i)
          if (dir[i].fddir != -1) {
            if (dir[i].match != '+') continue;
            if (! dir[i].udponly) buffer_PUTC(&dir[i].b, ch);
          }
      }
    for (i =0; i < dirn; ++i)
      if (dir[i].fddir != -1) {
        if (dir[i].match != '+') continue;
        if (! dir[i].udponly) {
          ch ='\n';
          buffer_PUTC(&dir[i].b, ch);
          buffer_flush(&dir[i].b);
        }
      }
  }

  for (i =0; i < dirn; ++i) {
    if (dir[i].ppid) while (! processorstop(&dir[i]));
    logdir_close(&dir[i]);
  }
  _exit(0);
}